

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  float *pfVar4;
  int *piVar5;
  char *pcVar6;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar7;
  float v_15;
  int i_15;
  float bias_5;
  float scale_out_5;
  float scale_in_5;
  char *ptr_4;
  int *intptr_4;
  int q_1;
  float v_14;
  int i_14;
  float scale_out_4;
  float scale_in_4;
  char *ptr_3;
  int *intptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  float v_13;
  int j_1;
  float bias_4;
  float scale_out_3;
  float scale_in_3;
  char *ptr_2;
  int *intptr_2;
  int i_13;
  float v_12;
  int j;
  float scale_out_2;
  float scale_in_2;
  char *ptr_1;
  int *intptr_1;
  int i_12;
  int h;
  int w_1;
  float v_11;
  int i_11;
  float v_10;
  int i_10;
  float bias_3;
  float v_9;
  int i_9;
  float v_8;
  int i_8;
  float v_7;
  int i_7;
  float bias_2;
  float v_6;
  int i_6;
  float scale_out_1;
  float v_5;
  int i_5;
  float v_4;
  int i_4;
  float bias_1;
  float v_3;
  int i_3;
  float scale_in_1;
  float v_2;
  int i_2;
  float v_1;
  int i_1;
  float bias;
  float v;
  int i;
  float scale_out;
  float scale_in;
  char *ptr;
  int *intptr;
  int w;
  int dims;
  float in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  Mat *in_stack_fffffffffffffca8;
  Mat *pMVar8;
  size_t in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  Mat *in_stack_fffffffffffffcc0;
  float in_stack_fffffffffffffcc8;
  float in_stack_fffffffffffffccc;
  float local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  int local_2a8;
  Mat local_298;
  char *local_250;
  Mat local_248;
  Mat *local_200;
  int local_1f4;
  float local_1f0;
  int local_1ec;
  float local_1e8;
  float local_1e4;
  Mat local_1e0;
  char *local_198;
  Mat local_180;
  int *local_138;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  float local_11c;
  int local_118;
  float local_114;
  float local_110;
  float local_10c;
  char *local_108;
  int *local_100;
  int local_f4;
  float local_f0;
  int local_ec;
  float local_e8;
  float local_e4;
  char *local_e0;
  int *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  float local_c0;
  int local_bc;
  float local_b8;
  int local_b4;
  float local_b0;
  float local_ac;
  int local_a8;
  float local_a4;
  int local_a0;
  float local_9c;
  int local_98;
  float local_94;
  float local_90;
  int local_8c;
  float local_88;
  float local_84;
  int local_80;
  float local_7c;
  int local_78;
  float local_74;
  float local_70;
  int local_6c;
  float local_68;
  float local_64;
  int local_60;
  float local_5c;
  int local_58;
  float local_54;
  float local_50;
  int local_4c;
  float local_48;
  float local_44;
  char *local_40;
  int *local_38;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  
  local_2c = in_RSI->dims;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_2c == 1) {
    local_30 = in_RSI->w;
    Mat::create(in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                in_stack_fffffffffffffcb0,(Allocator *)in_stack_fffffffffffffca8);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    if (bVar2) {
      return -100;
    }
    local_38 = Mat::operator_cast_to_int_(local_18);
    local_40 = Mat::operator_cast_to_signed_char_(local_20);
    if ((*(int *)(in_RDI + 0xd0) == 1) && (*(int *)(in_RDI + 0xd4) == 1)) {
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),0);
      local_44 = *pfVar4;
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),0);
      local_48 = *pfVar4;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_4c = 0; local_4c < local_30; local_4c = local_4c + 1) {
          local_50 = (float)local_38[local_4c] * local_44;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_4c] = cVar3;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),0);
        local_54 = *pfVar4;
        for (local_58 = 0; local_58 < local_30; local_58 = local_58 + 1) {
          local_5c = (float)local_38[local_58] * local_44 + local_54;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_58] = cVar3;
        }
      }
      else {
        for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
          fVar7 = (float)local_38[local_60] * local_44;
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_60);
          local_64 = fVar7 + *pfVar4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_60] = cVar3;
        }
      }
    }
    else if ((*(int *)(in_RDI + 0xd0) == 1) && (1 < *(int *)(in_RDI + 0xd4))) {
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),0);
      local_68 = *pfVar4;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_6c = 0; local_6c < local_30; local_6c = local_6c + 1) {
          local_70 = (float)local_38[local_6c] * local_68;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_6c);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_6c] = cVar3;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),0);
        local_74 = *pfVar4;
        for (local_78 = 0; local_78 < local_30; local_78 = local_78 + 1) {
          local_7c = (float)local_38[local_78] * local_68 + local_74;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_78);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_78] = cVar3;
        }
      }
      else {
        for (local_80 = 0; local_80 < local_30; local_80 = local_80 + 1) {
          fVar7 = (float)local_38[local_80] * local_68;
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_80);
          local_84 = fVar7 + *pfVar4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_80);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_80] = cVar3;
        }
      }
    }
    else if ((*(int *)(in_RDI + 0xd0) < 2) || (*(int *)(in_RDI + 0xd4) != 1)) {
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_a8 = 0; local_a8 < local_30; local_a8 = local_a8 + 1) {
          iVar1 = local_38[local_a8];
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_a8);
          local_ac = (float)iVar1 * *pfVar4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_a8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_a8] = cVar3;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),0);
        local_b0 = *pfVar4;
        for (local_b4 = 0; local_b4 < local_30; local_b4 = local_b4 + 1) {
          iVar1 = local_38[local_b4];
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_b4);
          local_b8 = (float)iVar1 * *pfVar4 + local_b0;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_b4);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_b4] = cVar3;
        }
      }
      else {
        for (local_bc = 0; local_bc < local_30; local_bc = local_bc + 1) {
          iVar1 = local_38[local_bc];
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_bc);
          fVar7 = *pfVar4;
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_bc);
          local_c0 = (float)iVar1 * fVar7 + *pfVar4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_bc);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_bc] = cVar3;
        }
      }
    }
    else {
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),0);
      local_88 = *pfVar4;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_8c = 0; local_8c < local_30; local_8c = local_8c + 1) {
          iVar1 = local_38[local_8c];
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_8c);
          local_90 = (float)iVar1 * *pfVar4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_8c] = cVar3;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),0);
        local_94 = *pfVar4;
        for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
          iVar1 = local_38[local_98];
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_98);
          local_9c = (float)iVar1 * *pfVar4 + local_94;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_98] = cVar3;
        }
      }
      else {
        for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
          iVar1 = local_38[local_a0];
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_a0);
          fVar7 = *pfVar4;
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_a0);
          local_a4 = (float)iVar1 * fVar7 + *pfVar4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_40[local_a0] = cVar3;
        }
      }
    }
  }
  if (local_2c == 2) {
    local_c4 = local_18->w;
    local_c8 = local_18->h;
    Mat::create(in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                (int)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                (Allocator *)in_stack_fffffffffffffca8);
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    if (bVar2) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_cc = 0; local_cc < local_c8; local_cc = local_cc + 1) {
        local_d8 = Mat::row<int_const>(local_18,local_cc);
        local_e0 = Mat::row<signed_char>(local_20,local_cc);
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),0);
          local_2fc = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_cc);
          local_2fc = *pfVar4;
        }
        local_e4 = local_2fc;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),0);
          local_300 = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_cc);
          local_300 = *pfVar4;
        }
        local_e8 = local_300;
        for (local_ec = 0; local_ec < local_c4; local_ec = local_ec + 1) {
          local_f0 = (float)local_d8[local_ec] * local_e4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_e0[local_ec] = cVar3;
        }
      }
    }
    else {
      for (local_f4 = 0; local_f4 < local_c8; local_f4 = local_f4 + 1) {
        local_100 = Mat::row<int_const>(local_18,local_f4);
        local_108 = Mat::row<signed_char>(local_20,local_f4);
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),0);
          local_304 = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_f4);
          local_304 = *pfVar4;
        }
        local_10c = local_304;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),0);
          local_308 = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_f4);
          local_308 = *pfVar4;
        }
        local_110 = local_308;
        if (*(int *)(in_RDI + 0xd8) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),0);
          local_30c = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_f4);
          local_30c = *pfVar4;
        }
        local_114 = local_30c;
        for (local_118 = 0; local_118 < local_c4; local_118 = local_118 + 1) {
          local_11c = (float)local_100[local_118] * local_10c + local_114;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_108[local_118] = cVar3;
        }
      }
    }
  }
  if (local_2c == 3) {
    local_120 = local_18->w;
    local_124 = local_18->h;
    local_128 = local_18->c;
    local_12c = local_120 * local_124;
    Mat::create(in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                (int)in_stack_fffffffffffffcb8,(int)(in_stack_fffffffffffffcb0 >> 0x20),
                (size_t)in_stack_fffffffffffffca8,
                (Allocator *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    if (bVar2) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_130 = 0; local_130 < local_128; local_130 = local_130 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
        piVar5 = Mat::operator_cast_to_int_(&local_180);
        Mat::~Mat((Mat *)0x705d92);
        local_138 = piVar5;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
        pcVar6 = Mat::operator_cast_to_signed_char_(&local_1e0);
        Mat::~Mat((Mat *)0x705dde);
        local_198 = pcVar6;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),0);
          in_stack_fffffffffffffccc = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_130);
          in_stack_fffffffffffffccc = *pfVar4;
        }
        local_1e4 = in_stack_fffffffffffffccc;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),0);
          in_stack_fffffffffffffcc8 = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_130);
          in_stack_fffffffffffffcc8 = *pfVar4;
        }
        local_1e8 = in_stack_fffffffffffffcc8;
        for (local_1ec = 0; local_1ec < local_12c; local_1ec = local_1ec + 1) {
          local_1f0 = (float)local_138[local_1ec] * local_1e4;
          activation_ss((float)(in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
                        in_stack_fffffffffffffca8);
          cVar3 = float2int8(in_stack_fffffffffffffca0);
          local_198[local_1ec] = cVar3;
        }
      }
    }
    else {
      for (local_1f4 = 0; local_1f4 < local_128; local_1f4 = local_1f4 + 1) {
        pMVar8 = &local_248;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
        in_stack_fffffffffffffcc0 = (Mat *)Mat::operator_cast_to_int_(pMVar8);
        Mat::~Mat((Mat *)0x706028);
        pMVar8 = &local_298;
        local_200 = in_stack_fffffffffffffcc0;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
        pcVar6 = Mat::operator_cast_to_signed_char_(pMVar8);
        Mat::~Mat((Mat *)0x706074);
        local_250 = pcVar6;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          Mat::operator[]((Mat *)(in_RDI + 0x128),0);
        }
        else {
          Mat::operator[]((Mat *)(in_RDI + 0x128),(long)local_1f4);
        }
        if (*(int *)(in_RDI + 0xd4) == 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),0);
          fVar7 = *pfVar4;
        }
        else {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x170),(long)local_1f4);
          fVar7 = *pfVar4;
        }
        if (*(int *)(in_RDI + 0xd8) == 1) {
          Mat::operator[]((Mat *)(in_RDI + 0x1b8),0);
        }
        else {
          Mat::operator[]((Mat *)(in_RDI + 0x1b8),(long)local_1f4);
        }
        for (local_2a8 = 0; local_2a8 < local_12c; local_2a8 = local_2a8 + 1) {
          activation_ss((float)((ulong)pcVar6 >> 0x20),(int)pcVar6,pMVar8);
          cVar3 = float2int8(fVar7);
          local_250[local_2a8] = cVar3;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        if (scale_in_data_size == 1 && scale_out_data_size == 1)
        {
            const float scale_in = scale_in_data[0];
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else if (scale_in_data_size == 1 && scale_out_data_size > 1)
        {
            const float scale_in = scale_in_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
        else if (scale_in_data_size > 1 && scale_out_data_size == 1)
        {
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else // if (scale_in_data_size > 1 && scale_out_data_size > 1)
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in + bias;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    return 0;
}